

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

char * duckdb::EnumUtil::ToChars<duckdb::ParquetVersion>(ParquetVersion value)

{
  char *pcVar1;
  NotImplementedException *this;
  int iVar2;
  undefined7 in_register_00000039;
  string local_60;
  string local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000039,value);
  if (iVar2 == 1) {
    pcVar1 = "V1";
  }
  else {
    if (iVar2 != 2) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Enum value: \'%s\' not implemented","");
      Exception::ConstructMessage<duckdb::ParquetVersion>(&local_40,&local_60,value);
      duckdb::NotImplementedException::NotImplementedException(this,(string *)&local_40);
      __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = "V2";
  }
  return pcVar1;
}

Assistant:

const char *EnumUtil::ToChars<ParquetVersion>(ParquetVersion value) {
	switch (value) {
	case ParquetVersion::V1:
		return "V1";
	case ParquetVersion::V2:
		return "V2";
	default:
		throw NotImplementedException(StringUtil::Format("Enum value: '%s' not implemented", value));
	}
}